

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask18_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  
  uVar1 = in[1];
  uVar2 = in[3];
  uVar3 = in[4];
  *out = uVar1 << 0x12 | *in;
  uVar4 = in[5];
  out[1] = uVar2 << 0x16 | in[2] << 4 | uVar1 >> 0xe;
  uVar5 = in[6];
  out[2] = uVar4 << 0x1a | uVar3 << 8 | uVar2 >> 10;
  uVar1 = in[7];
  out[3] = uVar1 << 0x1e | uVar5 << 0xc | uVar4 >> 6;
  out[4] = uVar1 >> 2;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask18_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (18 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (18 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (18 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (18 - 16);
  ++in;

  return out + 1;
}